

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_exhaustive.c
# Opt level: O0

void r_from_k(secp256k1_scalar *r,secp256k1_ge *group,int k,int *overflow)

{
  int *in_RCX;
  int in_EDX;
  long in_RSI;
  secp256k1_scalar *in_RDI;
  uchar x_bin [32];
  secp256k1_fe x;
  secp256k1_fe *in_stack_ffffffffffffff88;
  uchar *in_stack_ffffffffffffff90;
  undefined1 local_50 [48];
  int *local_20;
  int local_14;
  secp256k1_scalar *local_8;
  
  local_14 = in_EDX % 0xd;
  local_20 = in_RCX;
  local_8 = in_RDI;
  memcpy(local_50,(void *)(in_RSI + (long)local_14 * 0x68),0x30);
  secp256k1_fe_normalize((secp256k1_fe *)0x125961);
  secp256k1_fe_get_b32(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  secp256k1_scalar_set_b32(local_8,&stack0xffffffffffffff88,local_20);
  return;
}

Assistant:

static void r_from_k(secp256k1_scalar *r, const secp256k1_ge *group, int k, int* overflow) {
    secp256k1_fe x;
    unsigned char x_bin[32];
    k %= EXHAUSTIVE_TEST_ORDER;
    x = group[k].x;
    secp256k1_fe_normalize(&x);
    secp256k1_fe_get_b32(x_bin, &x);
    secp256k1_scalar_set_b32(r, x_bin, overflow);
}